

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O3

Result __thiscall
spectest::CommandRunner::OnAssertReturnCommand(CommandRunner *this,AssertReturnCommand *command)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint32_t line_number;
  pointer pcVar3;
  pointer pEVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ExpectedValue expected;
  TypedValue actual;
  Result RVar7;
  Enum EVar8;
  byte bVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ActionResult action_result;
  undefined8 local_b8;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  ActionResult local_98;
  Enum local_50;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  RunAction(&local_98,this,(command->super_CommandMixin<(wabt::CommandType)7>).super_Command.line,
            &command->action,Quiet);
  if (local_98.trap.obj_ == (Trap *)0x0) {
    if (((long)local_98.values.
               super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl
               .super__Vector_impl_data._M_finish -
         (long)local_98.values.
               super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl
               .super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
        ((long)(command->expected).
               super__Vector_base<spectest::ExpectedValue,_std::allocator<spectest::ExpectedValue>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(command->expected).
               super__Vector_base<spectest::ExpectedValue,_std::allocator<spectest::ExpectedValue>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x6db6db6db6db6db7 == 0) {
      if (local_98.values.
          super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_98.values.
          super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
          super__Vector_impl_data._M_start) {
        EVar8 = Ok;
      }
      else {
        lVar10 = 0;
        lVar11 = 0;
        uVar12 = 0;
        bVar9 = 0;
        do {
          pEVar4 = (command->expected).
                   super__Vector_base<spectest::ExpectedValue,_std::allocator<spectest::ExpectedValue>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_50 = local_98.types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar12].enum_;
          uStack_a4 = *(undefined4 *)
                       ((long)&((local_98.values.
                                 super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->type).enum_ + lVar10);
          puVar1 = (undefined8 *)
                   ((long)&(local_98.values.
                            super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                            ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar10);
          uVar5 = *puVar1;
          uVar6 = puVar1[1];
          local_b8._4_4_ = (undefined4)uVar5;
          uStack_b0 = (undefined4)((ulong)uVar5 >> 0x20);
          uStack_ac = (undefined4)uVar6;
          uStack_a8 = (undefined4)((ulong)uVar6 >> 0x20);
          uStack_3c = uStack_a8;
          uStack_48 = local_b8._4_4_;
          uStack_44 = uStack_b0;
          uStack_40 = uStack_ac;
          actual._4_4_ = (undefined4)local_b8;
          actual.type.enum_ = local_50;
          actual.value._20_4_ = uStack_34;
          actual.value.type.enum_ = uStack_a4;
          puVar1 = (undefined8 *)((long)pEVar4->nan + lVar11 + -0x14);
          puVar2 = (undefined8 *)((long)pEVar4->nan + lVar11 + -4);
          expected.value.value.field_0._8_8_ = *puVar1;
          expected.value._0_16_ = *(undefined1 (*) [16])((long)pEVar4->nan + lVar11 + -0x24);
          expected.value.value._16_8_ = puVar1[1];
          expected._32_8_ = *puVar2;
          expected.nan._4_8_ = puVar2[1];
          expected._48_8_ = *(undefined8 *)((long)pEVar4->nan + lVar11 + 0xc);
          actual.value.field_0.i64_ = uVar5;
          actual.value.field_0._8_8_ = uVar6;
          uStack_38 = uStack_a4;
          RVar7 = CheckAssertReturnResult(this,command,(int)uVar12,expected,actual,true);
          bVar9 = bVar9 | RVar7.enum_ == Error;
          uVar12 = uVar12 + 1;
          lVar11 = lVar11 + 0x38;
          lVar10 = lVar10 + 0x18;
        } while (uVar12 < (ulong)(((long)local_98.values.
                                         super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_98.values.
                                         super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555));
        EVar8 = (Enum)bVar9;
      }
      goto LAB_00172a35;
    }
    PrintError(this,(command->super_CommandMixin<(wabt::CommandType)7>).super_Command.line,
               "result length mismatch in assert_return: expected %zd, got %zd");
  }
  else {
    line_number = (command->super_CommandMixin<(wabt::CommandType)7>).super_Command.line;
    pcVar3 = ((local_98.trap.obj_)->message_)._M_dataplus._M_p;
    local_b8 = &uStack_a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,pcVar3,pcVar3 + ((local_98.trap.obj_)->message_)._M_string_length
              );
    PrintError(this,line_number,"unexpected trap: %s",local_b8);
    if (local_b8 != &uStack_a8) {
      operator_delete(local_b8);
    }
  }
  EVar8 = Error;
LAB_00172a35:
  if (local_98.trap.obj_ != (Trap *)0x0) {
    wabt::interp::Store::DeleteRoot(local_98.trap.store_,local_98.trap.root_index_);
    local_98.trap.obj_ = (Trap *)0x0;
    local_98.trap.store_ = (Store *)0x0;
    local_98.trap.root_index_ = 0;
  }
  if (local_98.values.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.values.
                    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98.types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return (Result)EVar8;
}

Assistant:

wabt::Result CommandRunner::OnAssertReturnCommand(
    const AssertReturnCommand* command) {
  ActionResult action_result =
      RunAction(command->line, &command->action, RunVerbosity::Quiet);

  if (action_result.trap) {
    PrintError(command->line, "unexpected trap: %s",
               action_result.trap->message().c_str());
    return wabt::Result::Error;
  }

  if (action_result.values.size() != command->expected.size()) {
    PrintError(command->line,
               "result length mismatch in assert_return: expected %" PRIzd
               ", got %" PRIzd,
               command->expected.size(), action_result.values.size());
    return wabt::Result::Error;
  }

  wabt::Result result = wabt::Result::Ok;
  for (size_t i = 0; i < action_result.values.size(); ++i) {
    const ExpectedValue& expected = command->expected[i];
    TypedValue actual{action_result.types[i], action_result.values[i]};

    result |= CheckAssertReturnResult(command, i, expected, actual, true);
  }

  return result;
}